

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard.cpp
# Opt level: O3

void __thiscall xcard::xcard(xcard *this,string *prefix,int debug)

{
  (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
  (this->prefix)._M_string_length = 0;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  this->VERSION = 0.03;
  std::__cxx11::string::_M_assign((string *)this);
  this->debug = debug;
  return;
}

Assistant:

xcard::xcard(std::string prefix, int debug)
{
    this->prefix = prefix;
    this->debug = debug;
}